

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  data_ref pacVar4;
  data_ref pacVar5;
  data_ref pacVar6;
  Session *pSVar7;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  uint64_t _binlog_sid_v_2;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_fffffffffffff668) [23];
  EventSource *in_stack_fffffffffffff670;
  char (*in_stack_fffffffffffff678) [33];
  atomic<unsigned_long> *in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  SessionWriter *in_stack_fffffffffffff690;
  EventSource *in_stack_fffffffffffff698;
  EventSource *eventSource;
  Session *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff6fc;
  PartiallyAdaptedEnum *in_stack_fffffffffffff700;
  atomic<unsigned_long> *paVar8;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  char (*in_stack_fffffffffffff710) [33];
  undefined1 local_63d [25];
  allocator local_624;
  allocator local_623;
  allocator local_622;
  allocator local_621;
  undefined8 local_620;
  undefined2 local_618;
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  undefined8 local_5b0;
  string local_5a8 [32];
  string local_588 [32];
  Session *local_568;
  char local_560 [15];
  char local_551;
  char local_550;
  char local_54f;
  char local_54e;
  allocator local_54d;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  cx_string<123UL> local_540;
  allocator local_4c4;
  allocator local_4c3;
  allocator local_4c2;
  allocator local_4c1;
  undefined8 local_4c0;
  undefined2 local_4b8;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  undefined8 local_450;
  string local_448 [32];
  string local_428 [32];
  __atomic_base<unsigned_long> local_408;
  undefined4 local_3fc;
  undefined1 local_3f5;
  undefined1 local_3f4;
  undefined1 local_3f3;
  undefined1 local_3f2;
  allocator local_3f1;
  undefined4 local_3f0;
  cx_string<31UL> local_3ec;
  allocator local_3cc;
  allocator local_3cb;
  allocator local_3ca;
  allocator local_3c9;
  undefined8 local_3c8;
  undefined2 local_3c0;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  undefined8 local_358;
  string local_350 [32];
  string local_330 [32];
  __atomic_base<unsigned_long> local_310;
  undefined4 local_308;
  undefined1 local_301;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_2fe;
  allocator local_2fd;
  undefined4 local_2fc;
  cx_string<32UL> local_2f5;
  allocator local_2d4;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  undefined8 local_2d0;
  undefined2 local_2c8;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  undefined8 local_260;
  string local_258 [32];
  string local_238 [32];
  __atomic_base<unsigned_long> local_218;
  undefined4 local_20c;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  allocator local_201;
  undefined4 local_200;
  cx_string<1UL> local_1f9;
  allocator local_1f7;
  allocator local_1f6;
  allocator local_1f5 [20];
  allocator local_1e1;
  undefined8 local_1e0;
  undefined2 local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  undefined8 local_170;
  string local_168 [32];
  string local_148 [32];
  __atomic_base<unsigned_long> local_128;
  undefined4 local_11c;
  Session *local_118;
  memory_order local_110;
  int local_10c;
  atomic<unsigned_long> *local_108;
  __atomic_base<unsigned_long> local_100;
  memory_order local_f8;
  undefined4 local_f4;
  atomic<unsigned_long> *local_f0;
  __atomic_base<unsigned_long> local_e8;
  memory_order local_e0;
  undefined4 local_dc;
  atomic<unsigned_long> *local_d8;
  __atomic_base<unsigned_long> local_d0;
  memory_order local_c8;
  undefined4 local_c4;
  atomic<unsigned_long> *local_c0;
  __atomic_base<unsigned_long> local_b8;
  memory_order local_b0;
  undefined4 local_ac;
  atomic<unsigned_long> *local_a8;
  Session *local_a0;
  memory_order local_98;
  int local_94;
  Session *local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_11c = 0;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024b7);
  if (SVar1 < 0x81) {
    local_a8 = &main::_binlog_sid;
    local_ac = 0;
    local_b0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_b8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_128 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_1e0 = 0;
      local_1d8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"main",&local_1e1);
      local_205 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"main",local_1f5);
      local_204 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_1f6);
      local_203 = 1;
      local_170 = 0x26;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Enum: {}",&local_1f7);
      local_202 = 1;
      local_200 = 0x7b;
      local_1f9 = binlog::detail::concatenated_tags<char_const(&)[9],Enum>
                            ((char (*) [9])in_stack_fffffffffffff678,
                             (Enum *)in_stack_fffffffffffff670);
      pacVar3 = mserialize::cx_string<1UL>::data(&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,*pacVar3,&local_201);
      local_202 = 0;
      local_203 = 0;
      local_204 = 0;
      local_205 = 0;
      local_128._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff670);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f7);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f6);
      std::allocator<char>::~allocator((allocator<char> *)local_1f5);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_128._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_20c = 0x7b;
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9],Enum>
              ((SessionWriter *)in_stack_fffffffffffff680,(uint64_t)in_stack_fffffffffffff678,
               (uint64_t)in_stack_fffffffffffff670,(char (*) [9])in_stack_fffffffffffff668,
               (Enum *)0x102ab5);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102ad0);
  if (SVar1 < 0x81) {
    local_c0 = &main::_binlog_sid;
    local_c4 = 0;
    local_c8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_d0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_218 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_2d0 = 0;
      local_2c8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"main",&local_2d1);
      local_301 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"main",&local_2d2);
      local_300 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_280,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_2d3);
      local_2ff = 1;
      local_260 = 0x2c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"Adapted enum: {}",&local_2d4);
      local_2fe = 1;
      local_2fc = 1;
      binlog::detail::concatenated_tags<char_const(&)[17],AdaptedEnum>
                ((char (*) [17])in_stack_fffffffffffff6a0,(AdaptedEnum *)in_stack_fffffffffffff698);
      pacVar4 = mserialize::cx_string<32UL>::data(&local_2f5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,*pacVar4,&local_2fd);
      local_2fe = 0;
      local_2ff = 0;
      local_300 = 0;
      local_301 = 0;
      local_218._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff670);
      std::allocator<char>::~allocator((allocator<char> *)&local_2fd);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d4);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d3);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d2);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_218._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_308 = 1;
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[17],AdaptedEnum>
              ((SessionWriter *)in_stack_fffffffffffff680,(uint64_t)in_stack_fffffffffffff678,
               (uint64_t)in_stack_fffffffffffff670,(char (*) [17])in_stack_fffffffffffff668,
               (AdaptedEnum *)0x1030be);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1030d9);
  if (SVar1 < 0x81) {
    local_d8 = &main::_binlog_sid;
    local_dc = 0;
    local_e0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_e8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_310 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_3c8 = 0;
      local_3c0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"main",&local_3c9);
      local_3f5 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,"main",&local_3ca);
      local_3f4 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_3cb);
      local_3f3 = 1;
      local_358 = 0x32;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"Scoped enum: {}",&local_3cc);
      local_3f2 = 1;
      local_3f0 = 0;
      binlog::detail::concatenated_tags<char_const(&)[16],ScopedEnum>
                ((char (*) [16])in_stack_fffffffffffff6a0,(ScopedEnum *)in_stack_fffffffffffff698);
      pacVar5 = mserialize::cx_string<31UL>::data(&local_3ec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,*pacVar5,&local_3f1);
      local_3f2 = 0;
      local_3f3 = 0;
      local_3f4 = 0;
      local_3f5 = 0;
      local_310._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff670);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_3cc);
      std::allocator<char>::~allocator((allocator<char> *)&local_3cb);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ca);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_310._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_3fc = 0;
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[16],ScopedEnum>
              ((SessionWriter *)in_stack_fffffffffffff680,(uint64_t)in_stack_fffffffffffff678,
               (uint64_t)in_stack_fffffffffffff670,(char (*) [16])in_stack_fffffffffffff668,
               (ScopedEnum *)0x1036c7);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1036e2);
  if (SVar1 < 0x81) {
    local_f0 = &main::_binlog_sid;
    local_f4 = 0;
    local_f8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_100 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_408 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_4c0 = 0;
      local_4b8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,"main",&local_4c1);
      local_551 = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_490,"main",&local_4c2);
      local_550 = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_470,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_4c3);
      local_54f = '\x01';
      local_450 = 0x37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"Partially adapted enum: {} {} {}",&local_4c4);
      local_54e = '\x01';
      local_544 = 0x14;
      local_548 = 0x1e;
      local_54c = 0x28;
      binlog::detail::
      concatenated_tags<char_const(&)[33],PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
                (in_stack_fffffffffffff710,
                 (PartiallyAdaptedEnum *)
                 CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                 in_stack_fffffffffffff700,
                 (PartiallyAdaptedEnum *)
                 CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      pacVar6 = mserialize::cx_string<123UL>::data(&local_540);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,*pacVar6,&local_54d);
      local_54e = '\0';
      local_54f = '\0';
      local_550 = '\0';
      local_551 = '\0';
      local_408._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff670);
      std::allocator<char>::~allocator((allocator<char> *)&local_54d);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c4);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c3);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c2);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      local_68 = &main::_binlog_sid;
      local_70._M_i = local_408._M_i;
      local_74 = 5;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70._M_i;
      if ((local_74 != 3) && (local_74 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_560[8] = '\x14';
    local_560[9] = '\0';
    local_560[10] = '\0';
    local_560[0xb] = '\0';
    local_560[4] = '\x1e';
    local_560[5] = '\0';
    local_560[6] = '\0';
    local_560[7] = '\0';
    local_560[0] = '(';
    local_560[1] = '\0';
    local_560[2] = '\0';
    local_560[3] = '\0';
    in_stack_fffffffffffff668 = (char (*) [23])local_560;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[33],PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
              (in_stack_fffffffffffff690,
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
               (uint64_t)in_stack_fffffffffffff680,in_stack_fffffffffffff678,
               (PartiallyAdaptedEnum *)in_stack_fffffffffffff670,
               (PartiallyAdaptedEnum *)in_stack_fffffffffffff668,
               (PartiallyAdaptedEnum *)in_stack_fffffffffffff6a0);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103d3b);
  if (SVar1 < 0x81) {
    local_108 = &main::_binlog_sid;
    local_10c = 0;
    paVar8 = &main::_binlog_sid;
    local_110 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_10c - 1U < 2) {
      local_118 = (Session *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_10c == 5) {
      local_118 = (Session *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_118 = (Session *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
    }
    local_568 = local_118;
    if (local_118 == (Session *)0x0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_620 = 0;
      local_618 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,"main",&local_621);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,"main",&local_622);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_623);
      local_5b0 = 0x3a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"Shadowed enum type: {}",&local_624);
      local_63d._1_4_ = 0;
      binlog::detail::concatenated_tags<char_const(&)[23],Nest::Nested>
                ((char (*) [23])in_stack_fffffffffffff690,
                 (Nested *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      pSVar7 = (Session *)mserialize::cx_string<19UL>::data((cx_string<19UL> *)(local_63d + 5));
      eventSource = (EventSource *)local_63d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_588,(char *)pSVar7,(allocator *)eventSource);
      local_568 = (Session *)binlog::Session::addEventSource(pSVar7,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff670);
      std::allocator<char>::~allocator((allocator<char> *)local_63d);
      std::allocator<char>::~allocator((allocator<char> *)&local_624);
      std::allocator<char>::~allocator((allocator<char> *)&local_623);
      std::allocator<char>::~allocator((allocator<char> *)&local_622);
      std::allocator<char>::~allocator((allocator<char> *)&local_621);
      local_88 = &main::_binlog_sid;
      local_90 = local_568;
      local_94 = 5;
      in_stack_fffffffffffff680 = &main::_binlog_sid;
      local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_a0 = local_90;
      if (local_94 == 3) {
        ((SessionWriter *)in_stack_fffffffffffff680)->_session = local_90;
      }
      else if (local_94 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_fffffffffffff680)->_session = local_90;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_fffffffffffff680)->_session = local_90;
      }
    }
    in_stack_fffffffffffff670 = (EventSource *)binlog::default_thread_local_writer();
    pSVar7 = local_568;
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[23],Nest::Nested>
              ((SessionWriter *)in_stack_fffffffffffff680,(uint64_t)pSVar7,
               (uint64_t)in_stack_fffffffffffff670,in_stack_fffffffffffff668,(Nested *)0x1042bd);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff670);
  return 0;
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}